

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_decay_reinit(arena_decay_t *decay,ssize_t decay_ms)

{
  long in_RSI;
  arena_decay_t *in_RDI;
  nstime_t *in_stack_ffffffffffffffe8;
  
  arena_decay_ms_write(in_RDI,in_RSI);
  if (0 < in_RSI) {
    nstime_init(&in_RDI->interval,in_RSI * 1000000);
    nstime_idivide(&in_RDI->interval,200);
  }
  nstime_init(&in_RDI->epoch,0);
  nstime_update_impl(in_stack_ffffffffffffffe8);
  in_RDI->jitter_state = (uint64_t)in_RDI;
  arena_decay_deadline_init(in_RDI);
  in_RDI->nunpurged = 0;
  memset(in_RDI->backlog,0,0x640);
  return;
}

Assistant:

static void
arena_decay_reinit(arena_decay_t *decay, ssize_t decay_ms) {
	arena_decay_ms_write(decay, decay_ms);
	if (decay_ms > 0) {
		nstime_init(&decay->interval, (uint64_t)decay_ms *
		    KQU(1000000));
		nstime_idivide(&decay->interval, SMOOTHSTEP_NSTEPS);
	}

	nstime_init(&decay->epoch, 0);
	nstime_update(&decay->epoch);
	decay->jitter_state = (uint64_t)(uintptr_t)decay;
	arena_decay_deadline_init(decay);
	decay->nunpurged = 0;
	memset(decay->backlog, 0, SMOOTHSTEP_NSTEPS * sizeof(size_t));
}